

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O0

void __thiscall qpdf::Tokenizer::inNameHex2(Tokenizer *this,char ch)

{
  char cVar1;
  char hval;
  char ch_local;
  Tokenizer *this_local;
  
  cVar1 = util::hex_decode_char(ch);
  if (cVar1 < '\x10') {
    this->char_code = (int)cVar1 | this->char_code;
    if (this->char_code == 0) {
      QTC::TC("qpdf","QPDFTokenizer null in name",0);
      std::__cxx11::string::operator=
                ((string *)&this->error_message,"null character not allowed in name token");
      std::__cxx11::string::operator+=((string *)&this->val,"#00");
      this->state = st_name;
      this->bad = true;
    }
    else {
      std::__cxx11::string::operator+=((string *)&this->val,(char)this->char_code);
      this->state = st_name;
    }
  }
  else {
    QTC::TC("qpdf","QPDFTokenizer bad name 2",0);
    std::__cxx11::string::operator=
              ((string *)&this->error_message,"name with stray # will not work with PDF >= 1.2");
    std::__cxx11::string::operator+=((string *)&this->val,'\0');
    std::__cxx11::string::operator+=((string *)&this->val,this->hex_char);
    this->state = st_name;
    inName(this,ch);
  }
  return;
}

Assistant:

void
Tokenizer::inNameHex2(char ch)
{
    if (char hval = util::hex_decode_char(ch); hval < '\20') {
        char_code |= int(hval);
    } else {
        QTC::TC("qpdf", "QPDFTokenizer bad name 2");
        error_message = "name with stray # will not work with PDF >= 1.2";
        // Use null to encode a bad # -- this is reversed in QPDF_Name::normalizeName.
        val += '\0';
        val += hex_char;
        state = st_name;
        inName(ch);
        return;
    }
    if (char_code == 0) {
        QTC::TC("qpdf", "QPDFTokenizer null in name");
        error_message = "null character not allowed in name token";
        val += "#00";
        state = st_name;
        bad = true;
    } else {
        val += char(char_code);
        state = st_name;
    }
}